

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::copy_graphics_pipeline
          (Impl *this,VkGraphicsPipelineCreateInfo *create_info,ScratchAllocator *alloc,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
          VkGraphicsPipelineCreateInfo **out_create_info)

{
  VkPipelineColorBlendStateCreateInfo *pVVar1;
  VkPipelineVertexInputStateCreateInfo *pVVar2;
  VkPipelineViewportStateCreateInfo *pVVar3;
  VkPipelineMultisampleStateCreateInfo *pVVar4;
  bool bVar5;
  VkGraphicsPipelineLibraryFlagsEXT state_flags_00;
  VkPipelineCreateFlags2KHR VVar6;
  VkPipelineCreateFlags2CreateInfo *pVVar7;
  VkPipelineColorBlendAttachmentState *pVVar8;
  VkVertexInputAttributeDescription *pVVar9;
  VkVertexInputBindingDescription *pVVar10;
  VkViewport *pVVar11;
  VkRect2D *pVVar12;
  uint *puVar13;
  GlobalStateInfo GVar14;
  byte local_121;
  VkPipelineMultisampleStateCreateInfo *ms;
  VkPipelineViewportStateCreateInfo *vp;
  VkPipelineVertexInputStateCreateInfo *vs;
  bool dynamic_attachments;
  VkPipelineColorBlendStateCreateInfo *blend;
  VkGraphicsPipelineLibraryFlagsEXT state_flags;
  GlobalStateInfo global_info;
  undefined1 local_8a [8];
  DynamicStateInfo dynamic_info;
  SubpassMeta subpass_meta;
  VkGraphicsPipelineCreateInfo *info;
  VkDevice device_local;
  uint32_t base_pipeline_count_local;
  VkPipeline *base_pipelines_local;
  ScratchAllocator *alloc_local;
  VkGraphicsPipelineCreateInfo *create_info_local;
  Impl *this_local;
  
  register0x00000000 = copy<VkGraphicsPipelineCreateInfo>(this,create_info,1,alloc);
  dynamic_info.coverage_to_color_location = true;
  dynamic_info.coverage_modulation_mode = true;
  memset(local_8a,0,0x40);
  if (create_info->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
    Hashing::parse_dynamic_state_info
              ((DynamicStateInfo *)&global_info.multisample_state,create_info->pDynamicState);
    memcpy(local_8a,&global_info.multisample_state,0x40);
  }
  GVar14 = Hashing::parse_global_state_info
                     (create_info,(DynamicStateInfo *)local_8a,
                      (SubpassMeta *)&dynamic_info.coverage_to_color_location);
  global_info._0_2_ = GVar14._8_2_;
  global_info.viewport_state = GVar14.module_state;
  state_flags_00 = graphics_pipeline_get_effective_state_flags(stack0xffffffffffffffb8);
  if (((undefined1  [11])GVar14 & (undefined1  [11])0x1) == (undefined1  [11])0x0) {
    stack0xffffffffffffffb8->pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  }
  if (((undefined1  [11])GVar14 & (undefined1  [11])0x1000000000000) == (undefined1  [11])0x0) {
    stack0xffffffffffffffb8->pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)0x0;
  }
  if (((undefined1  [11])GVar14 & (undefined1  [11])0x100000000) == (undefined1  [11])0x0) {
    stack0xffffffffffffffb8->pDepthStencilState = (VkPipelineDepthStencilStateCreateInfo *)0x0;
  }
  if (((undefined1  [11])GVar14 & (undefined1  [11])0x10000000000) == (undefined1  [11])0x0) {
    stack0xffffffffffffffb8->pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)0x0;
  }
  if (((undefined1  [11])GVar14 & (undefined1  [11])0x100) == (undefined1  [11])0x0) {
    stack0xffffffffffffffb8->pTessellationState = (VkPipelineTessellationStateCreateInfo *)0x0;
  }
  if (((undefined1  [11])GVar14 & (undefined1  [11])0x10000) == (undefined1  [11])0x0) {
    stack0xffffffffffffffb8->pViewportState = (VkPipelineViewportStateCreateInfo *)0x0;
  }
  if (((undefined1  [11])GVar14 & (undefined1  [11])0x1000000) == (undefined1  [11])0x0) {
    stack0xffffffffffffffb8->pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)0x0;
  }
  if (((undefined1  [11])GVar14 & (undefined1  [11])0x100000000000000) == (undefined1  [11])0x0) {
    stack0xffffffffffffffb8->pRasterizationState = (VkPipelineRasterizationStateCreateInfo *)0x0;
  }
  if ((global_info._0_2_ & 1) == 0) {
    stack0xffffffffffffffb8->renderPass = (VkRenderPass)0x0;
    stack0xffffffffffffffb8->subpass = 0;
  }
  if ((global_info._0_2_ & 0x100) == 0) {
    stack0xffffffffffffffb8->layout = (VkPipelineLayout)0x0;
  }
  VVar6 = normalize_pipeline_creation_flags((ulong)stack0xffffffffffffffb8->flags);
  stack0xffffffffffffffb8->flags = (VkPipelineCreateFlags)VVar6;
  pVVar7 = find_pnext<VkPipelineCreateFlags2CreateInfo>
                     (VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO,
                      stack0xffffffffffffffb8->pNext);
  if (pVVar7 != (VkPipelineCreateFlags2CreateInfo *)0x0) {
    stack0xffffffffffffffb8->flags = 0;
  }
  bVar5 = update_derived_pipeline<VkGraphicsPipelineCreateInfo>
                    (stack0xffffffffffffffb8,base_pipelines,base_pipeline_count);
  if (bVar5) {
    bVar5 = copy_sub_create_info<VkPipelineTessellationStateCreateInfo>
                      (this,&stack0xffffffffffffffb8->pTessellationState,alloc,
                       (DynamicStateInfo *)local_8a,state_flags_00);
    if (bVar5) {
      bVar5 = copy_sub_create_info<VkPipelineColorBlendStateCreateInfo>
                        (this,&stack0xffffffffffffffb8->pColorBlendState,alloc,
                         (DynamicStateInfo *)local_8a,state_flags_00);
      if (bVar5) {
        bVar5 = copy_sub_create_info<VkPipelineVertexInputStateCreateInfo>
                          (this,&stack0xffffffffffffffb8->pVertexInputState,alloc,
                           (DynamicStateInfo *)local_8a,state_flags_00);
        if (bVar5) {
          bVar5 = copy_sub_create_info<VkPipelineMultisampleStateCreateInfo>
                            (this,&stack0xffffffffffffffb8->pMultisampleState,alloc,
                             (DynamicStateInfo *)local_8a,state_flags_00);
          if (bVar5) {
            bVar5 = copy_sub_create_info<VkPipelineViewportStateCreateInfo>
                              (this,&stack0xffffffffffffffb8->pViewportState,alloc,
                               (DynamicStateInfo *)local_8a,state_flags_00);
            if (bVar5) {
              bVar5 = copy_sub_create_info<VkPipelineInputAssemblyStateCreateInfo>
                                (this,&stack0xffffffffffffffb8->pInputAssemblyState,alloc,
                                 (DynamicStateInfo *)local_8a,state_flags_00);
              if (bVar5) {
                bVar5 = copy_sub_create_info<VkPipelineDepthStencilStateCreateInfo>
                                  (this,&stack0xffffffffffffffb8->pDepthStencilState,alloc,
                                   (DynamicStateInfo *)local_8a,state_flags_00);
                if (bVar5) {
                  bVar5 = copy_sub_create_info<VkPipelineRasterizationStateCreateInfo>
                                    (this,&stack0xffffffffffffffb8->pRasterizationState,alloc,
                                     (DynamicStateInfo *)local_8a,state_flags_00);
                  if (bVar5) {
                    if ((global_info.viewport_state & 1U) == 0) {
                      stack0xffffffffffffffb8->stageCount = 0;
                      stack0xffffffffffffffb8->pStages = (VkPipelineShaderStageCreateInfo *)0x0;
                    }
                    else {
                      bVar5 = copy_stages<VkGraphicsPipelineCreateInfo>
                                        (this,stack0xffffffffffffffb8,alloc,device,gsmcii,
                                         (DynamicStateInfo *)local_8a);
                      if (!bVar5) {
                        return false;
                      }
                    }
                    bVar5 = copy_dynamic_state<VkGraphicsPipelineCreateInfo>
                                      (this,stack0xffffffffffffffb8,alloc,
                                       (DynamicStateInfo *)local_8a);
                    if (bVar5) {
                      if (stack0xffffffffffffffb8->pColorBlendState !=
                          (VkPipelineColorBlendStateCreateInfo *)0x0) {
                        pVVar1 = stack0xffffffffffffffb8->pColorBlendState;
                        local_121 = 0;
                        if (((dynamic_info.tessellation_domain_origin & 1U) != 0) &&
                           (local_121 = 0, (dynamic_info.polygon_mode & 1U) != 0)) {
                          local_121 = dynamic_info.depth_clamp_enable;
                        }
                        if ((local_121 & 1) == 0) {
                          pVVar8 = copy<VkPipelineColorBlendAttachmentState>
                                             (this,pVVar1->pAttachments,
                                              (ulong)pVVar1->attachmentCount,alloc);
                          pVVar1->pAttachments = pVVar8;
                        }
                        else {
                          pVVar1->pAttachments = (VkPipelineColorBlendAttachmentState *)0x0;
                        }
                      }
                      if (stack0xffffffffffffffb8->pVertexInputState !=
                          (VkPipelineVertexInputStateCreateInfo *)0x0) {
                        pVVar2 = stack0xffffffffffffffb8->pVertexInputState;
                        pVVar9 = copy<VkVertexInputAttributeDescription>
                                           (this,pVVar2->pVertexAttributeDescriptions,
                                            (ulong)pVVar2->vertexAttributeDescriptionCount,alloc);
                        pVVar2->pVertexAttributeDescriptions = pVVar9;
                        pVVar10 = copy<VkVertexInputBindingDescription>
                                            (this,pVVar2->pVertexBindingDescriptions,
                                             (ulong)pVVar2->vertexBindingDescriptionCount,alloc);
                        pVVar2->pVertexBindingDescriptions = pVVar10;
                      }
                      if (stack0xffffffffffffffb8->pViewportState !=
                          (VkPipelineViewportStateCreateInfo *)0x0) {
                        pVVar3 = stack0xffffffffffffffb8->pViewportState;
                        if (pVVar3->pViewports != (VkViewport *)0x0) {
                          pVVar11 = copy<VkViewport>(this,pVVar3->pViewports,
                                                     (ulong)pVVar3->viewportCount,alloc);
                          pVVar3->pViewports = pVVar11;
                        }
                        if (pVVar3->pScissors != (VkRect2D *)0x0) {
                          pVVar12 = copy<VkRect2D>(this,pVVar3->pScissors,
                                                   (ulong)pVVar3->scissorCount,alloc);
                          pVVar3->pScissors = pVVar12;
                        }
                      }
                      if (stack0xffffffffffffffb8->pMultisampleState !=
                          (VkPipelineMultisampleStateCreateInfo *)0x0) {
                        pVVar4 = stack0xffffffffffffffb8->pMultisampleState;
                        if ((dynamic_info.discard_rectangle_mode & 1U) != 0) {
                          pVVar4->pSampleMask = (VkSampleMask *)0x0;
                        }
                        if (pVVar4->pSampleMask != (VkSampleMask *)0x0) {
                          puVar13 = copy<unsigned_int>(this,pVVar4->pSampleMask,
                                                       (long)((int)(pVVar4->rasterizationSamples +
                                                                   (VK_SAMPLE_COUNT_16_BIT|
                                                                    VK_SAMPLE_COUNT_8_BIT|
                                                                    VK_SAMPLE_COUNT_4_BIT|
                                                                    VK_SAMPLE_COUNT_2_BIT|
                                                                   VK_SAMPLE_COUNT_1_BIT)) / 0x20),
                                                       alloc);
                          pVVar4->pSampleMask = puVar13;
                        }
                      }
                      bVar5 = copy_pnext_chain(this,stack0xffffffffffffffb8->pNext,alloc,
                                               &stack0xffffffffffffffb8->pNext,
                                               (DynamicStateInfo *)local_8a,state_flags_00);
                      if (bVar5) {
                        *out_create_info = stack0xffffffffffffffb8;
                        this_local._7_1_ = true;
                      }
                      else {
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::Impl::copy_graphics_pipeline(const VkGraphicsPipelineCreateInfo *create_info, ScratchAllocator &alloc,
                                                 const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
                                                 VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
                                                 VkGraphicsPipelineCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);

	// At the time of copy we don't really know the subpass meta state since the render pass is still being
	// parsed in a thread.
	// Assume that the subpass uses color or depth when copying.
	// This could in theory break if app passes pointer to invalid data while taking advantage of this
	// rule, but it has never happened so far ...
	const SubpassMeta subpass_meta = { true, true };

	DynamicStateInfo dynamic_info = {};
	if (create_info->pDynamicState)
		dynamic_info = Hashing::parse_dynamic_state_info(*create_info->pDynamicState);
	GlobalStateInfo global_info = Hashing::parse_global_state_info(*create_info, dynamic_info, subpass_meta);
	auto state_flags = graphics_pipeline_get_effective_state_flags(*info);

	// Remove pointers which a driver must ignore depending on other state.
	if (!global_info.input_assembly)
		info->pInputAssemblyState = nullptr;
	if (!global_info.vertex_input)
		info->pVertexInputState = nullptr;
	if (!global_info.depth_stencil_state)
		info->pDepthStencilState = nullptr;
	if (!global_info.color_blend_state)
		info->pColorBlendState = nullptr;
	if (!global_info.tessellation_state)
		info->pTessellationState = nullptr;
	if (!global_info.viewport_state)
		info->pViewportState = nullptr;
	if (!global_info.multisample_state)
		info->pMultisampleState = nullptr;
	if (!global_info.rasterization_state)
		info->pRasterizationState = nullptr;

	// If we can ignore render pass state, do just that.
	if (!global_info.render_pass_state)
	{
		info->renderPass = VK_NULL_HANDLE;
		info->subpass = 0;
	}

	if (!global_info.layout_state)
		info->layout = VK_NULL_HANDLE;

	info->flags = normalize_pipeline_creation_flags(info->flags);
	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, info->pNext))
		info->flags = 0;

	if (!update_derived_pipeline(info, base_pipelines, base_pipeline_count))
		return false;

	if (!copy_sub_create_info(info->pTessellationState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pColorBlendState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pVertexInputState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pMultisampleState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pViewportState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pInputAssemblyState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pDepthStencilState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pRasterizationState, alloc, &dynamic_info, state_flags))
		return false;

	if (global_info.module_state)
	{
		if (!copy_stages(info, alloc, device, gsmcii, &dynamic_info))
			return false;
	}
	else
	{
		info->stageCount = 0;
		info->pStages = nullptr;
	}

	if (!copy_dynamic_state(info, alloc, &dynamic_info))
		return false;

	if (info->pColorBlendState)
	{
		auto &blend = const_cast<VkPipelineColorBlendStateCreateInfo &>(*info->pColorBlendState);

		// Special EDS3 rule. If all of these are set, we must ignore the pAttachments pointer.
		const bool dynamic_attachments = dynamic_info.color_blend_enable &&
		                                 dynamic_info.color_write_mask &&
		                                 dynamic_info.color_blend_equation;

		if (dynamic_attachments)
			blend.pAttachments = nullptr;
		else
			blend.pAttachments = copy(blend.pAttachments, blend.attachmentCount, alloc);
	}

	if (info->pVertexInputState)
	{
		auto &vs = const_cast<VkPipelineVertexInputStateCreateInfo &>(*info->pVertexInputState);
		vs.pVertexAttributeDescriptions = copy(vs.pVertexAttributeDescriptions, vs.vertexAttributeDescriptionCount, alloc);
		vs.pVertexBindingDescriptions = copy(vs.pVertexBindingDescriptions, vs.vertexBindingDescriptionCount, alloc);
	}

	if (info->pViewportState)
	{
		auto &vp = const_cast<VkPipelineViewportStateCreateInfo &>(*info->pViewportState);
		if (vp.pViewports)
			vp.pViewports = copy(vp.pViewports, vp.viewportCount, alloc);
		if (vp.pScissors)
			vp.pScissors = copy(vp.pScissors, vp.scissorCount, alloc);
	}

	if (info->pMultisampleState)
	{
		auto &ms = const_cast<VkPipelineMultisampleStateCreateInfo &>(*info->pMultisampleState);
		if (dynamic_info.sample_mask)
			ms.pSampleMask = nullptr;

		// If rasterizationSamples is dynamic, but not sample mask,
		// rasterizationSamples still provides the size of the sample mask array.
		if (ms.pSampleMask)
			ms.pSampleMask = copy(ms.pSampleMask, (ms.rasterizationSamples + 31) / 32, alloc);
	}

	if (!copy_pnext_chain(info->pNext, alloc, &info->pNext, &dynamic_info, state_flags))
		return false;

	*out_create_info = info;
	return true;
}